

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

void __thiscall
t_dart_generator::generate_service_server(t_dart_generator *this,t_service *tservice)

{
  bool bVar1;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  ostream *poVar2;
  t_service *ptVar3;
  ulong uVar4;
  string *psVar5;
  reference pptVar6;
  string local_2f8;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_2d8;
  t_function **local_2d0;
  string local_2c8;
  string local_2a8;
  allocator local_281;
  string local_280;
  allocator local_259;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_1d8;
  t_function **local_1d0;
  allocator local_1c1;
  string local_1c0;
  allocator local_199;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  undefined1 local_118 [8];
  string class_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  allocator local_91;
  string local_90 [8];
  string extends_processor;
  undefined1 local_68 [8];
  string extends;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_38;
  iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  t_service *tservice_local;
  t_dart_generator *this_local;
  
  __x = t_service::get_functions(tservice);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator(&local_38);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar2 = std::operator<<(poVar2,
                           "typedef void ProcessFunction(int seqid, TProtocol iprot, TProtocol oprot);"
                          );
  std::operator<<(poVar2,(string *)&endl2_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_68,"",(allocator *)(extends_processor.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(extends_processor.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"",&local_91);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  ptVar3 = t_service::get_extends(tservice);
  if (ptVar3 != (t_service *)0x0) {
    ptVar3 = t_service::get_extends(tservice);
    get_ttype_class_name_abi_cxx11_(&local_b8,this,&ptVar3->super_t_type);
    std::__cxx11::string::operator=((string *)local_68,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&class_name.field_2 + 8)," extends ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
    std::operator+(&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&class_name.field_2 + 8),"Processor");
    std::__cxx11::string::operator=(local_90,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)(class_name.field_2._M_local_buf + 8));
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                 &(this->super_t_oop_generator).super_t_generator.service_name_,"Processor");
  std::__cxx11::string::string
            ((string *)&local_158,
             (string *)&(this->super_t_oop_generator).super_t_generator.service_name_);
  get_file_name(&local_138,this,&local_158);
  std::__cxx11::string::string((string *)&local_178,(string *)local_118);
  export_class_to_library(this,&local_138,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar2 = std::operator<<(poVar2,"class ");
  poVar2 = std::operator<<(poVar2,(string *)local_118);
  poVar2 = std::operator<<(poVar2,local_90);
  std::operator<<(poVar2," implements TProcessor");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198," ",&local_199);
  scope_up(this,(ostream *)&this->f_service_,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar2 = std::operator<<(poVar2,(string *)local_118);
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = std::operator<<(poVar2,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.service_name_);
  std::operator<<(poVar2," iface)");
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    t_generator::indent_up((t_generator *)this);
    std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    std::operator<<(poVar2,": super(iface)");
    t_generator::indent_down((t_generator *)this);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c0," ",&local_1c1);
  scope_up(this,(ostream *)&this->f_service_,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar2 = std::operator<<(poVar2,"iface_ = iface;");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  local_1d0 = (t_function **)
              std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                        ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  local_38._M_current = local_1d0;
  while( true ) {
    local_1d8._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_1d8);
    if (!bVar1) break;
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar2 = std::operator<<(poVar2,"PROCESS_MAP[\"");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_38);
    psVar5 = t_function::get_name_abi_cxx11_(*pptVar6);
    poVar2 = std::operator<<(poVar2,(string *)psVar5);
    poVar2 = std::operator<<(poVar2,"\"] = ");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_38);
    psVar5 = t_function::get_name_abi_cxx11_(*pptVar6);
    std::__cxx11::string::string((string *)&local_218,(string *)psVar5);
    get_member_name(&local_1f8,this,&local_218);
    poVar2 = std::operator<<(poVar2,(string *)&local_1f8);
    poVar2 = std::operator<<(poVar2,";");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++(&local_38);
  }
  std::__cxx11::string::string((string *)&local_238,(string *)&endl2_abi_cxx11_);
  scope_down(this,(ostream *)&this->f_service_,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar2 = std::operator<<(poVar2,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.service_name_);
  poVar2 = std::operator<<(poVar2," iface_;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar2 = std::operator<<(poVar2,"final Map<String, ProcessFunction> PROCESS_MAP = {};");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  std::operator<<(poVar2,"bool process(TProtocol iprot, TProtocol oprot)");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_258," ",&local_259);
  scope_up(this,(ostream *)&this->f_service_,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar2 = std::operator<<(poVar2,"TMessage msg = iprot.readMessageBegin();");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar2 = std::operator<<(poVar2,"ProcessFunction fn = PROCESS_MAP[msg.name];");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  std::operator<<(poVar2,"if (fn == null)");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_280," ",&local_281);
  scope_up(this,(ostream *)&this->f_service_,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar2 = std::operator<<(poVar2,"TProtocolUtil.skip(iprot, TType.STRUCT);");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar2 = std::operator<<(poVar2,"iprot.readMessageEnd();");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar2 = std::operator<<(poVar2,
                           "TApplicationError x = new TApplicationError(TApplicationErrorType.UNKNOWN_METHOD, \"Invalid method name: \'\"+msg.name+\"\'\");"
                          );
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar2 = std::operator<<(poVar2,
                           "oprot.writeMessageBegin(new TMessage(msg.name, TMessageType.EXCEPTION, msg.seqid));"
                          );
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar2 = std::operator<<(poVar2,"x.write(oprot);");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar2 = std::operator<<(poVar2,"oprot.writeMessageEnd();");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar2 = std::operator<<(poVar2,"oprot.transport.flush();");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar2 = std::operator<<(poVar2,"return true;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::string((string *)&local_2a8,(string *)&::endl_abi_cxx11_);
  scope_down(this,(ostream *)&this->f_service_,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar2 = std::operator<<(poVar2,"fn(msg.seqid, iprot, oprot);");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar2 = std::operator<<(poVar2,"return true;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::string((string *)&local_2c8,(string *)&endl2_abi_cxx11_);
  scope_down(this,(ostream *)&this->f_service_,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  local_2d0 = (t_function **)
              std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                        ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  local_38._M_current = local_2d0;
  while( true ) {
    local_2d8._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_2d8);
    if (!bVar1) break;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_38);
    generate_process_function(this,tservice,*pptVar6);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++(&local_38);
  }
  std::__cxx11::string::string((string *)&local_2f8,(string *)&endl2_abi_cxx11_);
  scope_down(this,(ostream *)&this->f_service_,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)local_68);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  return;
}

Assistant:

void t_dart_generator::generate_service_server(t_service* tservice) {
  // Generate the dispatch methods
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;

  // typedef
  indent(f_service_) << "typedef void ProcessFunction(int seqid, TProtocol iprot, TProtocol oprot);" << endl2;

  // Extends stuff
  string extends = "";
  string extends_processor = "";
  if (tservice->get_extends() != nullptr) {
    extends = get_ttype_class_name(tservice->get_extends());
    extends_processor = " extends " + extends + "Processor";
  }

  // Generate the header portion
  string class_name =  service_name_ + "Processor";
  export_class_to_library(get_file_name(service_name_), class_name);
  indent(f_service_) << "class " << class_name << extends_processor << " implements TProcessor";
  scope_up(f_service_);

  indent(f_service_) << class_name << "(" << service_name_ << " iface)";
  if (!extends.empty()) {
    indent_up();
    f_service_ << endl;
    indent(f_service_) << ": super(iface)";
    indent_down();
  }
  scope_up(f_service_);

  if (extends.empty()) {
    indent(f_service_) << "iface_ = iface;" << endl;
  }

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    indent(f_service_) << "PROCESS_MAP[\"" << (*f_iter)->get_name()
               << "\"] = " << get_member_name((*f_iter)->get_name()) << ";" << endl;
  }
  scope_down(f_service_, endl2);

  indent(f_service_) << service_name_ << " iface_;" << endl;

  if (extends.empty()) {
    indent(f_service_) << "final Map<String, ProcessFunction> PROCESS_MAP = {};" << endl;
  }

  f_service_ << endl;

  // Generate the server implementation
  indent(f_service_) << "bool process(TProtocol iprot, TProtocol oprot)";
  scope_up(f_service_);
  indent(f_service_) << "TMessage msg = iprot.readMessageBegin();" << endl;
  indent(f_service_) << "ProcessFunction fn = PROCESS_MAP[msg.name];" << endl;
  indent(f_service_) << "if (fn == null)";
  scope_up(f_service_);
  indent(f_service_) << "TProtocolUtil.skip(iprot, TType.STRUCT);" << endl;
  indent(f_service_) << "iprot.readMessageEnd();" << endl;
  indent(f_service_) << "TApplicationError x = new TApplicationError(TApplicationErrorType.UNKNOWN_METHOD, "
         "\"Invalid method name: '\"+msg.name+\"'\");" << endl;
  indent(f_service_) << "oprot.writeMessageBegin(new TMessage(msg.name, TMessageType.EXCEPTION, msg.seqid));" << endl;
  indent(f_service_) << "x.write(oprot);" << endl;
  indent(f_service_) << "oprot.writeMessageEnd();" << endl;
  indent(f_service_) << "oprot.transport.flush();" << endl;
  indent(f_service_) << "return true;" << endl;
  scope_down(f_service_);
  indent(f_service_) << "fn(msg.seqid, iprot, oprot);" << endl;
  indent(f_service_) << "return true;" << endl;
  scope_down(f_service_, endl2); // process function

  // Generate the process subfunctions
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    generate_process_function(tservice, *f_iter);
  }

  scope_down(f_service_, endl2); // class
}